

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseOneof
          (Parser *this,OneofDescriptorProto *oneof_decl,DescriptorProto *containing_type,
          int oneof_index,LocationRecorder *oneof_location,
          LocationRecorder *containing_type_location,FileDescriptorProto *containing_file)

{
  ulong uVar1;
  ErrorCollector *pEVar2;
  Rep *pRVar3;
  bool bVar4;
  int iVar5;
  string *output;
  FieldDescriptorProto *pFVar6;
  OneofOptions *pOVar7;
  undefined8 *puVar8;
  Arena *arena;
  undefined1 local_70 [36];
  int local_4c;
  LocationRecorder *local_48;
  RepeatedPtrFieldBase *local_40;
  RepeatedPtrField<google::protobuf::DescriptorProto> *local_38;
  
  local_4c = oneof_index;
  bVar4 = Consume(this,"oneof");
  if (bVar4) {
    LocationRecorder::LocationRecorder((LocationRecorder *)local_70,oneof_location,1);
    *(byte *)(oneof_decl->_has_bits_).has_bits_ = (byte)(oneof_decl->_has_bits_).has_bits_[0] | 1;
    uVar1 = (oneof_decl->super_Message).super_MessageLite._internal_metadata_.ptr_;
    puVar8 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar8 = (undefined8 *)*puVar8;
    }
    local_48 = oneof_location;
    output = internal::ArenaStringPtr::Mutable_abi_cxx11_(&oneof_decl->name_,puVar8);
    bVar4 = ConsumeIdentifier(this,output,"Expected oneof name.");
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_70);
    if ((bVar4) && (bVar4 = ConsumeEndOfDeclaration(this,"{",local_48), bVar4)) {
      local_40 = &(containing_type->field_).super_RepeatedPtrFieldBase;
      local_38 = &containing_type->nested_type_;
      while ((this->input_->current_).type != TYPE_END) {
        iVar5 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
        if (iVar5 == 0) {
          LocationRecorder::LocationRecorder((LocationRecorder *)local_70,local_48,2);
          *(byte *)(oneof_decl->_has_bits_).has_bits_ =
               (byte)(oneof_decl->_has_bits_).has_bits_[0] | 2;
          if (oneof_decl->options_ == (OneofOptions *)0x0) {
            uVar1 = (oneof_decl->super_Message).super_MessageLite._internal_metadata_.ptr_;
            arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
            if ((uVar1 & 1) != 0) {
              arena = *(Arena **)arena;
            }
            pOVar7 = Arena::CreateMaybeMessage<google::protobuf::OneofOptions>(arena);
            oneof_decl->options_ = pOVar7;
          }
          bVar4 = ParseOption(this,&oneof_decl->options_->super_Message,(LocationRecorder *)local_70
                              ,containing_file,OPTION_STATEMENT);
          LocationRecorder::~LocationRecorder((LocationRecorder *)local_70);
          if (!bVar4) {
            return false;
          }
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
          if (((iVar5 == 0) ||
              (iVar5 = std::__cxx11::string::compare((char *)&(this->input_->current_).text),
              iVar5 == 0)) ||
             (iVar5 = std::__cxx11::string::compare((char *)&(this->input_->current_).text),
             iVar5 == 0)) {
            local_70._0_8_ = local_70 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_70,
                       "Fields in oneofs must not have labels (required / optional / repeated).","")
            ;
            pEVar2 = this->error_collector_;
            if (pEVar2 != (ErrorCollector *)0x0) {
              (*pEVar2->_vptr_ErrorCollector[2])
                        (pEVar2,(ulong)(uint)(this->input_->current_).line,
                         (ulong)(uint)(this->input_->current_).column,(LocationRecorder *)local_70);
            }
            this->had_errors_ = true;
            if ((Parser *)local_70._0_8_ != (Parser *)(local_70 + 0x10)) {
              operator_delete((void *)local_70._0_8_);
            }
            io::Tokenizer::Next(this->input_);
          }
          LocationRecorder::LocationRecorder
                    ((LocationRecorder *)local_70,containing_type_location,2,
                     (containing_type->field_).super_RepeatedPtrFieldBase.current_size_);
          pRVar3 = (containing_type->field_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar3 == (Rep *)0x0) {
LAB_00343792:
            pFVar6 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>
                               (((RepeatedPtrFieldBase *)&local_40->arena_)->arena_);
            pFVar6 = (FieldDescriptorProto *)
                     internal::RepeatedPtrFieldBase::AddOutOfLineHelper(local_40,pFVar6);
          }
          else {
            iVar5 = (containing_type->field_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar3->allocated_size <= iVar5) goto LAB_00343792;
            (containing_type->field_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
            pFVar6 = (FieldDescriptorProto *)pRVar3->elements[iVar5];
          }
          bVar4 = FieldDescriptorProto_Label_IsValid(1);
          if (!bVar4) {
            __assert_fail("::PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Label_IsValid(value)",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
                          ,0x2793,
                          "void google::protobuf::FieldDescriptorProto::_internal_set_label(::google::protobuf::FieldDescriptorProto_Label)"
                         );
          }
          pFVar6->label_ = 1;
          (pFVar6->_has_bits_).has_bits_[0] = (pFVar6->_has_bits_).has_bits_[0] | 0x280;
          pFVar6->oneof_index_ = local_4c;
          bVar4 = ParseMessageFieldNoLabel
                            (this,pFVar6,local_38,containing_type_location,3,
                             (LocationRecorder *)local_70,containing_file);
          if (!bVar4) {
            SkipStatement(this);
          }
          LocationRecorder::~LocationRecorder((LocationRecorder *)local_70);
        }
        bVar4 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
        if (bVar4) {
          return true;
        }
      }
      local_70._0_8_ = local_70 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"Reached end of input in oneof definition (missing \'}\').","");
      pEVar2 = this->error_collector_;
      if (pEVar2 != (ErrorCollector *)0x0) {
        (*pEVar2->_vptr_ErrorCollector[2])
                  (pEVar2,(ulong)(uint)(this->input_->current_).line,
                   (ulong)(uint)(this->input_->current_).column,local_70);
      }
      this->had_errors_ = true;
      if ((Parser *)local_70._0_8_ != (Parser *)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_);
      }
    }
  }
  return false;
}

Assistant:

bool Parser::ParseOneof(OneofDescriptorProto* oneof_decl,
                        DescriptorProto* containing_type, int oneof_index,
                        const LocationRecorder& oneof_location,
                        const LocationRecorder& containing_type_location,
                        const FileDescriptorProto* containing_file) {
  DO(Consume("oneof"));

  {
    LocationRecorder name_location(oneof_location,
                                   OneofDescriptorProto::kNameFieldNumber);
    DO(ConsumeIdentifier(oneof_decl->mutable_name(), "Expected oneof name."));
  }

  DO(ConsumeEndOfDeclaration("{", &oneof_location));

  do {
    if (AtEnd()) {
      AddError("Reached end of input in oneof definition (missing '}').");
      return false;
    }

    if (LookingAt("option")) {
      LocationRecorder option_location(
          oneof_location, OneofDescriptorProto::kOptionsFieldNumber);
      if (!ParseOption(oneof_decl->mutable_options(), option_location,
                       containing_file, OPTION_STATEMENT)) {
        return false;
      }
      continue;
    }

    // Print a nice error if the user accidentally tries to place a label
    // on an individual member of a oneof.
    if (LookingAt("required") || LookingAt("optional") ||
        LookingAt("repeated")) {
      AddError(
          "Fields in oneofs must not have labels (required / optional "
          "/ repeated).");
      // We can continue parsing here because we understand what the user
      // meant.  The error report will still make parsing fail overall.
      input_->Next();
    }

    LocationRecorder field_location(containing_type_location,
                                    DescriptorProto::kFieldFieldNumber,
                                    containing_type->field_size());

    FieldDescriptorProto* field = containing_type->add_field();
    field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
    field->set_oneof_index(oneof_index);

    if (!ParseMessageFieldNoLabel(field, containing_type->mutable_nested_type(),
                                  containing_type_location,
                                  DescriptorProto::kNestedTypeFieldNumber,
                                  field_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  } while (!TryConsumeEndOfDeclaration("}", NULL));

  return true;
}